

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  bool bVar1;
  bool bVar2;
  ImGuiTabItem *pIVar3;
  ImGuiTabItem *__dest;
  ImGuiShrinkWidthItem *pIVar4;
  ImGuiTabBar *in_RDI;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImVec2 IVar10;
  ImGuiWindow *window;
  bool teleport;
  ImGuiTabItem *scroll_track_selected_tab_1;
  ImGuiTabItem *tab_3;
  int tab_n_2;
  ImGuiTabBarSection *section_1;
  int section_n_3;
  float tab_offset;
  int section_tab_index;
  int section_n_2;
  float shrinked_width;
  ImGuiTabItem *tab_2;
  int tab_n_1;
  int shrink_data_offset;
  int shrink_data_count;
  float width_excess;
  bool central_section_is_visible;
  float section_2_w;
  float section_1_w;
  float section_0_w;
  ImGuiTabItem *scroll_track_selected_tab;
  int section_n_1;
  int shrink_buffer_index;
  ImGuiTabBarSection *section;
  int section_n;
  bool has_close_button;
  char *tab_name;
  ImGuiTabItem *tab_1;
  int tab_n;
  bool found_selected_tab_id;
  int curr_section_n;
  ImGuiTabItem *most_recently_selected_tab;
  int shrink_buffer_indexes [3];
  ImGuiTabItem *tab_to_select;
  bool tab_list_popup_button;
  ImGuiID scroll_track_selected_tab_id;
  int prev_tab_section_n;
  ImGuiTabItem *prev_tab;
  int curr_tab_section_n;
  ImGuiTabItem *tab;
  int tab_src_n;
  ImGuiTabBarSection sections [3];
  bool need_sort_by_section;
  int tab_dst_n;
  ImGuiContext *g;
  float in_stack_fffffffffffffe28;
  float in_stack_fffffffffffffe2c;
  undefined3 uVar11;
  float in_stack_fffffffffffffe30;
  float in_stack_fffffffffffffe34;
  int local_1c4;
  undefined8 in_stack_fffffffffffffe40;
  ImGuiTabBar *pIVar12;
  float in_stack_fffffffffffffe48;
  float in_stack_fffffffffffffe4c;
  int in_stack_fffffffffffffe50;
  float in_stack_fffffffffffffe54;
  float in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  float fVar13;
  int local_18c;
  float local_188;
  float local_184;
  int local_180;
  int local_17c;
  ImVec2 local_158;
  ImGuiWindow *local_150;
  char local_141;
  ImGuiTabItem *local_140;
  ImGuiTabItem *local_138;
  int local_12c;
  int *local_128;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int iVar14;
  float local_118;
  int local_114;
  float local_100;
  float local_f4;
  int local_d8;
  float local_c4;
  int local_a4;
  int local_9c;
  ImGuiTabItem *local_98;
  int local_8c [3];
  ImGuiTabItem *local_80;
  undefined1 local_71;
  ImGuiID local_70;
  int local_6c;
  ImGuiTabItem *local_68;
  int local_5c;
  ImGuiTabItem *local_58;
  float local_4c;
  undefined1 local_48 [8];
  float local_40;
  int local_3c;
  float local_38;
  float local_34;
  ImGuiID local_30;
  float local_2c;
  float local_28;
  undefined1 auStack_24 [28];
  ImGuiTabBar *local_8;
  
  auStack_24._20_8_ = GImGui;
  in_RDI->WantLayout = false;
  auStack_24._16_4_ = 0.0;
  auStack_24[0xf] = 0;
  pIVar12 = (ImGuiTabBar *)local_48;
  local_8 = in_RDI;
  do {
    ImGuiTabBarSection::ImGuiTabBarSection((ImGuiTabBarSection *)0x1a81c8);
    pIVar12 = (ImGuiTabBar *)((long)&(pIVar12->Tabs).Data + 4);
  } while (pIVar12 != (ImGuiTabBar *)auStack_24);
  for (local_4c = 0.0; (int)local_4c < (local_8->Tabs).Size; local_4c = (float)((int)local_4c + 1))
  {
    local_58 = ImVector<ImGuiTabItem>::operator[](&local_8->Tabs,(int)local_4c);
    if ((local_58->LastFrameVisible < local_8->PrevFrameVisible) ||
       ((local_58->WantClose & 1U) != 0)) {
      if (local_8->VisibleTabId == local_58->ID) {
        local_8->VisibleTabId = 0;
      }
      if (local_8->SelectedTabId == local_58->ID) {
        local_8->SelectedTabId = 0;
      }
      if (local_8->NextSelectedTabId == local_58->ID) {
        local_8->NextSelectedTabId = 0;
      }
    }
    else {
      if ((float)auStack_24._16_4_ != local_4c) {
        pIVar3 = ImVector<ImGuiTabItem>::operator[](&local_8->Tabs,(int)local_4c);
        __dest = ImVector<ImGuiTabItem>::operator[](&local_8->Tabs,auStack_24._16_4_);
        memcpy(__dest,pIVar3,0x23);
      }
      local_58 = ImVector<ImGuiTabItem>::operator[](&local_8->Tabs,auStack_24._16_4_);
      local_58->IndexDuringLayout = (ImS16)auStack_24._16_4_;
      if ((local_58->Flags & 0x40U) == 0) {
        local_17c = 1;
        if ((local_58->Flags & 0x80U) != 0) {
          local_17c = 2;
        }
      }
      else {
        local_17c = 0;
      }
      local_5c = local_17c;
      if (0 < (int)auStack_24._16_4_) {
        local_68 = ImVector<ImGuiTabItem>::operator[](&local_8->Tabs,auStack_24._16_4_ + -1);
        if ((local_68->Flags & 0x40U) == 0) {
          local_180 = 1;
          if ((local_68->Flags & 0x80U) != 0) {
            local_180 = 2;
          }
        }
        else {
          local_180 = 0;
        }
        local_6c = local_180;
        if ((local_5c == 0) && (local_180 != 0)) {
          auStack_24[0xf] = 1;
        }
        if ((local_180 == 2) && (local_5c != 2)) {
          auStack_24[0xf] = 1;
        }
      }
      *(int *)(local_48 + (long)local_5c * 0xc) = *(int *)(local_48 + (long)local_5c * 0xc) + 1;
      auStack_24._16_4_ = auStack_24._16_4_ + 1;
    }
  }
  if ((local_8->Tabs).Size != auStack_24._16_4_) {
    ImVector<ImGuiTabItem>::resize
              ((ImVector<ImGuiTabItem> *)
               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               (int)in_stack_fffffffffffffe2c);
  }
  if ((auStack_24[0xf] & 1) != 0) {
    qsort((local_8->Tabs).Data,(long)(local_8->Tabs).Size,0x24,TabItemComparerBySection);
  }
  if (((int)local_48._0_4_ < 1) || ((int)(local_3c + local_30) < 1)) {
    local_184 = 0.0;
  }
  else {
    local_184 = (((ImGuiStyle *)(auStack_24._20_8_ + 0x1560))->ItemInnerSpacing).x;
  }
  local_40 = local_184;
  if ((local_3c < 1) || ((int)local_30 < 1)) {
    local_188 = 0.0;
  }
  else {
    local_188 = (((ImGuiStyle *)(auStack_24._20_8_ + 0x1560))->ItemInnerSpacing).x;
  }
  local_34 = local_188;
  local_70 = 0;
  if (local_8->NextSelectedTabId != 0) {
    local_8->SelectedTabId = local_8->NextSelectedTabId;
    local_8->NextSelectedTabId = 0;
    local_70 = local_8->SelectedTabId;
  }
  if (local_8->ReorderRequestTabId != 0) {
    bVar2 = TabBarProcessReorder
                      ((ImGuiTabBar *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68))
    ;
    if ((bVar2) && (local_8->ReorderRequestTabId == local_8->SelectedTabId)) {
      local_70 = local_8->ReorderRequestTabId;
    }
    local_8->ReorderRequestTabId = 0;
  }
  local_71 = (local_8->Flags & 4U) != 0;
  if (((bool)local_71) &&
     (local_80 = TabBarTabListPopupButton(pIVar12), local_80 != (ImGuiTabItem *)0x0)) {
    local_70 = local_80->ID;
    local_8->SelectedTabId = local_70;
  }
  local_8c[0] = 0;
  local_8c[1] = local_48._0_4_ + local_30;
  local_8c[2] = local_48._0_4_;
  ImVector<ImGuiShrinkWidthItem>::resize
            ((ImVector<ImGuiShrinkWidthItem> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             (int)in_stack_fffffffffffffe2c);
  local_98 = (ImGuiTabItem *)0x0;
  local_9c = -1;
  bVar2 = false;
  for (local_a4 = 0; local_a4 < (local_8->Tabs).Size; local_a4 = local_a4 + 1) {
    pIVar3 = ImVector<ImGuiTabItem>::operator[](&local_8->Tabs,local_a4);
    if (((local_98 == (ImGuiTabItem *)0x0) ||
        (local_98->LastFrameSelected < pIVar3->LastFrameSelected)) &&
       ((pIVar3->Flags & 0x200000U) == 0)) {
      local_98 = pIVar3;
    }
    if (pIVar3->ID == local_8->SelectedTabId) {
      bVar2 = true;
    }
    if ((local_70 == 0) && (*(ImGuiID *)(auStack_24._20_8_ + 0x1c5c) == pIVar3->ID)) {
      local_70 = pIVar3->ID;
    }
    ImGuiTabBar::GetTabName(local_8,pIVar3);
    IVar10 = TabItemCalcSize((char *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                             SUB81((ulong)in_stack_fffffffffffffe40 >> 0x38,0));
    local_c4 = IVar10.x;
    pIVar3->ContentWidth = local_c4;
    if ((pIVar3->Flags & 0x40U) == 0) {
      local_18c = 1;
      if ((pIVar3->Flags & 0x80U) != 0) {
        local_18c = 2;
      }
    }
    else {
      local_18c = 0;
    }
    if (local_18c == local_9c) {
      fVar13 = (((ImGuiStyle *)(auStack_24._20_8_ + 0x1560))->ItemInnerSpacing).x;
    }
    else {
      fVar13 = 0.0;
    }
    *(float *)(local_48 + (long)local_18c * 0xc + 4) =
         pIVar3->ContentWidth + fVar13 + *(float *)(local_48 + (long)local_18c * 0xc + 4);
    local_9c = local_18c;
    iVar14 = local_8c[local_18c];
    local_8c[local_18c] = iVar14 + 1;
    in_stack_fffffffffffffe64 = local_a4;
    pIVar4 = ImVector<ImGuiShrinkWidthItem>::operator[]
                       ((ImVector<ImGuiShrinkWidthItem> *)(auStack_24._20_8_ + 0x2080),iVar14);
    pIVar4->Index = in_stack_fffffffffffffe64;
    fVar13 = pIVar3->ContentWidth;
    pIVar4 = ImVector<ImGuiShrinkWidthItem>::operator[]
                       ((ImVector<ImGuiShrinkWidthItem> *)(auStack_24._20_8_ + 0x2080),iVar14);
    pIVar4->Width = fVar13;
    pIVar3->Width = pIVar3->ContentWidth;
  }
  local_8->WidthAllTabsIdeal = 0.0;
  for (local_d8 = 0; local_d8 < 3; local_d8 = local_d8 + 1) {
    local_8->WidthAllTabsIdeal =
         *(float *)(local_48 + (long)local_d8 * 0xc + 4) + (&local_40)[(long)local_d8 * 3] +
         local_8->WidthAllTabsIdeal;
  }
  fVar13 = local_8->WidthAllTabsIdeal;
  fVar5 = ImRect::GetWidth(&local_8->BarRect);
  if (((fVar5 < fVar13) && (1 < (local_8->Tabs).Size)) &&
     (((local_8->Flags & 0x10U) == 0 &&
      ((((local_8->Flags & 0x80U) != 0 &&
        (pIVar3 = TabBarScrollingButtons
                            ((ImGuiTabBar *)
                             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)),
        pIVar3 != (ImGuiTabItem *)0x0)) && (local_70 = pIVar3->ID, (pIVar3->Flags & 0x200000U) == 0)
       ))))) {
    local_8->SelectedTabId = local_70;
  }
  fVar5 = (float)local_48._4_4_ + local_40;
  fVar6 = local_38 + local_34;
  fVar7 = local_2c + local_28;
  fVar8 = fVar5 + fVar7;
  fVar9 = ImRect::GetWidth(&local_8->BarRect);
  bVar1 = fVar9 <= fVar8;
  if (bVar1) {
    in_stack_fffffffffffffe54 = fVar5 + fVar7;
    local_f4 = ImRect::GetWidth(&local_8->BarRect);
    local_f4 = in_stack_fffffffffffffe54 - local_f4;
  }
  else {
    fVar9 = ImRect::GetWidth(&local_8->BarRect);
    local_f4 = ImMax<float>(fVar6 - ((fVar9 - fVar5) - fVar7),0.0);
    in_stack_fffffffffffffe58 = fVar6;
  }
  if ((0.0 < local_f4) && (((local_8->Flags & 0x40U) != 0 || (bVar1)))) {
    if (bVar1) {
      iVar14 = local_48._0_4_ + local_30;
      fVar5 = 0.0;
    }
    else {
      fVar5 = (float)(local_48._0_4_ + local_30);
      iVar14 = local_3c;
    }
    in_stack_fffffffffffffe4c = fVar5;
    in_stack_fffffffffffffe50 = iVar14;
    ShrinkWidths((ImGuiShrinkWidthItem *)CONCAT44(in_stack_fffffffffffffe54,iVar14),(int)fVar5,
                 in_stack_fffffffffffffe48);
    for (local_100 = fVar5; (int)local_100 < (int)fVar5 + iVar14;
        local_100 = (float)((int)local_100 + 1)) {
      pIVar12 = local_8;
      pIVar4 = ImVector<ImGuiShrinkWidthItem>::operator[]
                         ((ImVector<ImGuiShrinkWidthItem> *)(auStack_24._20_8_ + 0x2080),
                          (int)local_100);
      pIVar3 = ImVector<ImGuiTabItem>::operator[](&pIVar12->Tabs,pIVar4->Index);
      pIVar4 = ImVector<ImGuiShrinkWidthItem>::operator[]
                         ((ImVector<ImGuiShrinkWidthItem> *)(auStack_24._20_8_ + 0x2080),
                          (int)local_100);
      fVar6 = (float)(int)pIVar4->Width;
      if (0.0 <= fVar6) {
        if ((pIVar3->Flags & 0x40U) == 0) {
          local_1c4 = 1;
          if ((pIVar3->Flags & 0x80U) != 0) {
            local_1c4 = 2;
          }
        }
        else {
          local_1c4 = 0;
        }
        *(float *)(local_48 + (long)local_1c4 * 0xc + 4) =
             *(float *)(local_48 + (long)local_1c4 * 0xc + 4) - (pIVar3->Width - fVar6);
        pIVar3->Width = fVar6;
      }
    }
  }
  local_114 = 0;
  local_118 = 0.0;
  local_8->WidthAllTabs = 0.0;
  for (iVar14 = 0; iVar14 < 3; iVar14 = iVar14 + 1) {
    local_128 = (int *)(local_48 + (long)iVar14 * 0xc);
    if (iVar14 == 2) {
      fVar5 = ImRect::GetWidth(&local_8->BarRect);
      fVar5 = ImMax<float>(0.0,fVar5 - (float)local_128[1]);
      local_118 = ImMin<float>(fVar5,local_118);
    }
    for (local_12c = 0; local_12c < *local_128; local_12c = local_12c + 1) {
      local_138 = ImVector<ImGuiTabItem>::operator[](&local_8->Tabs,local_114 + local_12c);
      local_138->Offset = local_118;
      if (local_12c < *local_128 + -1) {
        in_stack_fffffffffffffe34 =
             (((ImGuiStyle *)(auStack_24._20_8_ + 0x1560))->ItemInnerSpacing).x;
      }
      else {
        in_stack_fffffffffffffe34 = 0.0;
      }
      local_118 = local_138->Width + in_stack_fffffffffffffe34 + local_118;
    }
    fVar5 = ImMax<float>((float)local_128[1] + (float)local_128[2],0.0);
    local_8->WidthAllTabs = fVar5 + local_8->WidthAllTabs;
    local_118 = (float)local_128[2] + local_118;
    local_114 = *local_128 + local_114;
  }
  if (!bVar2) {
    local_8->SelectedTabId = 0;
  }
  if (((local_8->SelectedTabId == 0) && (local_8->NextSelectedTabId == 0)) &&
     (local_98 != (ImGuiTabItem *)0x0)) {
    local_70 = local_98->ID;
    local_8->SelectedTabId = local_70;
  }
  local_8->VisibleTabId = local_8->SelectedTabId;
  local_8->VisibleTabWasSubmitted = false;
  if ((local_70 != 0) &&
     (local_140 = TabBarFindTabByID((ImGuiTabBar *)
                                    CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),0)
     , local_140 != (ImGuiTabItem *)0x0)) {
    TabBarScrollToTab((ImGuiTabBar *)CONCAT44(in_stack_fffffffffffffe64,fVar13),
                      (ImGuiTabItem *)CONCAT44(fVar8,in_stack_fffffffffffffe58),
                      (ImGuiTabBarSection *)
                      CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  }
  fVar13 = TabBarScrollClamp((ImGuiTabBar *)
                             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                             in_stack_fffffffffffffe2c);
  local_8->ScrollingAnim = fVar13;
  fVar13 = TabBarScrollClamp((ImGuiTabBar *)
                             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                             in_stack_fffffffffffffe2c);
  local_8->ScrollingTarget = fVar13;
  if ((local_8->ScrollingAnim != local_8->ScrollingTarget) ||
     (NAN(local_8->ScrollingAnim) || NAN(local_8->ScrollingTarget))) {
    fVar13 = ImMax<float>(local_8->ScrollingSpeed,*(float *)(auStack_24._20_8_ + 0x1928) * 70.0);
    local_8->ScrollingSpeed = fVar13;
    fVar13 = ImMax<float>(local_8->ScrollingSpeed,
                          ABS(local_8->ScrollingTarget - local_8->ScrollingAnim) / 0.3);
    local_8->ScrollingSpeed = fVar13;
    uVar11 = SUB43(in_stack_fffffffffffffe30,0);
    in_stack_fffffffffffffe30 = (float)CONCAT13(1,uVar11);
    if (*(int *)(auStack_24._20_8_ + 0x1a10) <= local_8->PrevFrameVisible + 1) {
      in_stack_fffffffffffffe30 =
           (float)CONCAT13(*(float *)(auStack_24._20_8_ + 0x1928) * 10.0 <
                           local_8->ScrollingTargetDistToVisibility,uVar11);
    }
    local_141 = (char)((uint)in_stack_fffffffffffffe30 >> 0x18);
    if (local_141 == '\0') {
      in_stack_fffffffffffffe2c =
           ImLinearSweep(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                         in_stack_fffffffffffffe28);
    }
    else {
      in_stack_fffffffffffffe2c = local_8->ScrollingTarget;
    }
    local_8->ScrollingAnim = in_stack_fffffffffffffe2c;
  }
  else {
    local_8->ScrollingSpeed = 0.0;
  }
  local_8->ScrollingRectMinX = (local_8->BarRect).Min.x + (float)local_48._4_4_ + local_40;
  local_8->ScrollingRectMaxX = ((local_8->BarRect).Max.x - local_2c) - local_34;
  if ((local_8->Flags & 0x100000U) == 0) {
    ImVector<char>::resize
              ((ImVector<char> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               (int)in_stack_fffffffffffffe2c);
  }
  local_150 = *(ImGuiWindow **)(auStack_24._20_8_ + 0x1a88);
  (local_150->DC).CursorPos = (local_8->BarRect).Min;
  fVar13 = local_8->WidthAllTabsIdeal;
  fVar5 = ImRect::GetHeight(&local_8->BarRect);
  ImVec2::ImVec2(&local_158,fVar13,fVar5);
  ItemSize((ImVec2 *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
           in_stack_fffffffffffffe4c);
  return;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect by compacting list
    // Detect if we need to sort out tab list (e.g. in rare case where a tab changed section)
    int tab_dst_n = 0;
    bool need_sort_by_section = false;
    ImGuiTabBarSection sections[3]; // Layout sections: Leading, Central, Trailing
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible || tab->WantClose)
        {
            // Remove tab
            if (tab_bar->VisibleTabId == tab->ID) { tab_bar->VisibleTabId = 0; }
            if (tab_bar->SelectedTabId == tab->ID) { tab_bar->SelectedTabId = 0; }
            if (tab_bar->NextSelectedTabId == tab->ID) { tab_bar->NextSelectedTabId = 0; }
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];

        tab = &tab_bar->Tabs[tab_dst_n];
        tab->IndexDuringLayout = (ImS16)tab_dst_n;

        // We will need sorting if tabs have changed section (e.g. moved from one of Leading/Central/Trailing to another)
        int curr_tab_section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
        if (tab_dst_n > 0)
        {
            ImGuiTabItem* prev_tab = &tab_bar->Tabs[tab_dst_n - 1];
            int prev_tab_section_n = (prev_tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (prev_tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
            if (curr_tab_section_n == 0 && prev_tab_section_n != 0)
                need_sort_by_section = true;
            if (prev_tab_section_n == 2 && curr_tab_section_n != 2)
                need_sort_by_section = true;
        }

        sections[curr_tab_section_n].TabCount++;
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    if (need_sort_by_section)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerBySection);

    // Calculate spacing between sections
    sections[0].Spacing = sections[0].TabCount > 0 && (sections[1].TabCount + sections[2].TabCount) > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;
    sections[1].Spacing = sections[1].TabCount > 0 && sections[2].TabCount > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (TabBarProcessReorder(tab_bar))
            if (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)
                scroll_track_selected_tab_id = tab_bar->ReorderRequestTabId;
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Min.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Leading/Trailing tabs will be shrink only if central one aren't visible anymore, so layout the shrink data as: leading, trailing, central
    // (whereas our tabs are stored as: leading, central, trailing)
    int shrink_buffer_indexes[3] = { 0, sections[0].TabCount + sections[2].TabCount, sections[0].TabCount };
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);

    // Compute ideal tabs widths + store them into shrink buffer
    ImGuiTabItem* most_recently_selected_tab = NULL;
    int curr_section_n = -1;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if ((most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected) && !(tab->Flags & ImGuiTabItemFlags_Button))
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) ? false : true;
        tab->ContentWidth = TabItemCalcSize(tab_name, has_close_button).x;

        int section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
        ImGuiTabBarSection* section = &sections[section_n];
        section->Width += tab->ContentWidth + (section_n == curr_section_n ? g.Style.ItemInnerSpacing.x : 0.0f);
        curr_section_n = section_n;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        int shrink_buffer_index = shrink_buffer_indexes[section_n]++;
        g.ShrinkWidthBuffer[shrink_buffer_index].Index = tab_n;
        g.ShrinkWidthBuffer[shrink_buffer_index].Width = tab->ContentWidth;

        IM_ASSERT(tab->ContentWidth > 0.0f);
        tab->Width = tab->ContentWidth;
    }

    // Compute total ideal width (used for e.g. auto-resizing a window)
    tab_bar->WidthAllTabsIdeal = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
        tab_bar->WidthAllTabsIdeal += sections[section_n].Width + sections[section_n].Spacing;

    // Horizontal scrolling buttons
    // (note that TabBarScrollButtons() will alter BarRect.Max.x)
    if ((tab_bar->WidthAllTabsIdeal > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll))
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarScrollingButtons(tab_bar))
        {
            scroll_track_selected_tab_id = scroll_track_selected_tab->ID;
            if (!(scroll_track_selected_tab->Flags & ImGuiTabItemFlags_Button))
                tab_bar->SelectedTabId = scroll_track_selected_tab_id;
        }

    // Shrink widths if full tabs don't fit in their allocated space
    float section_0_w = sections[0].Width + sections[0].Spacing;
    float section_1_w = sections[1].Width + sections[1].Spacing;
    float section_2_w = sections[2].Width + sections[2].Spacing;
    bool central_section_is_visible = (section_0_w + section_2_w) < tab_bar->BarRect.GetWidth();
    float width_excess;
    if (central_section_is_visible)
        width_excess = ImMax(section_1_w - (tab_bar->BarRect.GetWidth() - section_0_w - section_2_w), 0.0f); // Excess used to shrink central section
    else
        width_excess = (section_0_w + section_2_w) - tab_bar->BarRect.GetWidth(); // Excess used to shrink leading/trailing section

    // With ImGuiTabBarFlags_FittingPolicyScroll policy, we will only shrink leading/trailing if the central section is not visible anymore
    if (width_excess > 0.0f && ((tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown) || !central_section_is_visible))
    {
        int shrink_data_count = (central_section_is_visible ? sections[1].TabCount : sections[0].TabCount + sections[2].TabCount);
        int shrink_data_offset = (central_section_is_visible ? sections[0].TabCount + sections[2].TabCount : 0);
        ShrinkWidths(g.ShrinkWidthBuffer.Data + shrink_data_offset, shrink_data_count, width_excess);

        // Apply shrunk values into tabs and sections
        for (int tab_n = shrink_data_offset; tab_n < shrink_data_offset + shrink_data_count; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index];
            float shrinked_width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
            if (shrinked_width < 0.0f)
                continue;

            int section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
            sections[section_n].Width -= (tab->Width - shrinked_width);
            tab->Width = shrinked_width;
        }
    }

    // Layout all active tabs
    int section_tab_index = 0;
    float tab_offset = 0.0f;
    tab_bar->WidthAllTabs = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
    {
        ImGuiTabBarSection* section = &sections[section_n];
        if (section_n == 2)
            tab_offset = ImMin(ImMax(0.0f, tab_bar->BarRect.GetWidth() - section->Width), tab_offset);

        for (int tab_n = 0; tab_n < section->TabCount; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[section_tab_index + tab_n];
            tab->Offset = tab_offset;
            tab_offset += tab->Width + (tab_n < section->TabCount - 1 ? g.Style.ItemInnerSpacing.x : 0.0f);
        }
        tab_bar->WidthAllTabs += ImMax(section->Width + section->Spacing, 0.0f);
        tab_offset += section->Spacing;
        section_tab_index += section->TabCount;
    }

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab, sections);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }
    tab_bar->ScrollingRectMinX = tab_bar->BarRect.Min.x + sections[0].Width + sections[0].Spacing;
    tab_bar->ScrollingRectMaxX = tab_bar->BarRect.Max.x - sections[2].Width - sections[1].Spacing;

    // Clear name buffers
    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        tab_bar->TabsNames.Buf.resize(0);

    // Actual layout in host window (we don't do it in BeginTabBar() so as not to waste an extra frame)
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.CursorPos = tab_bar->BarRect.Min;
    ItemSize(ImVec2(tab_bar->WidthAllTabsIdeal, tab_bar->BarRect.GetHeight()), tab_bar->FramePadding.y);
}